

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall kj::anon_unknown_123::AsyncPipe::~AsyncPipe(AsyncPipe *this)

{
  bool bVar1;
  AsyncCapabilityStream *pAVar2;
  bool local_71;
  Fault local_60;
  Fault f;
  Maybe<kj::AsyncCapabilityStream_&> *local_48;
  DebugComparison<kj::Maybe<kj::AsyncCapabilityStream_&>_&,_const_kj::None_&> local_40;
  bool local_11;
  AsyncPipe *pAStack_10;
  bool _kjCondition;
  AsyncPipe *this_local;
  
  pAStack_10 = this;
  local_48 = (Maybe<kj::AsyncCapabilityStream_&> *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->state);
  kj::_::DebugExpression<kj::Maybe<kj::AsyncCapabilityStream&>&>::operator==
            (&local_40,(DebugExpression<kj::Maybe<kj::AsyncCapabilityStream&>&> *)&local_48,
             (None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_40);
  local_71 = true;
  if (!bVar1) {
    pAVar2 = Own<kj::AsyncCapabilityStream,_std::nullptr_t>::get(&this->ownState);
    local_71 = pAVar2 != (AsyncCapabilityStream *)0x0;
  }
  local_11 = local_71;
  if (local_71 == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[82]>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0xe9,FAILED,"state == kj::none || ownState.get() != nullptr",
               "_kjCondition,\"destroying AsyncPipe with operation still in-progress; probably going to segfault\""
               ,&local_11,
               (char (*) [82])
               "destroying AsyncPipe with operation still in-progress; probably going to segfault");
    kj::_::Debug::Fault::~Fault(&local_60);
  }
  Maybe<kj::ForkedPromise<void>_>::~Maybe(&this->readAbortPromise);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&this->readAbortFulfiller);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::~Own(&this->ownState);
  Refcounted::~Refcounted(&this->super_Refcounted);
  AsyncCapabilityStream::~AsyncCapabilityStream(&this->super_AsyncCapabilityStream);
  return;
}

Assistant:

~AsyncPipe() noexcept(false) {
    KJ_REQUIRE(state == kj::none || ownState.get() != nullptr,
        "destroying AsyncPipe with operation still in-progress; probably going to segfault") {
      // Don't std::terminate().
      break;
    }
  }